

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O3

ssize_t __thiscall
wasm::LEB<int,_signed_char>::read(LEB<int,_signed_char> *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  string *psVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 in_register_00000034;
  ulong uVar7;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  ulong uVar8;
  
  uVar7 = CONCAT44(in_register_00000034,__fd);
  this->value = 0;
  bVar3 = 0;
  uVar8 = uVar7;
  uVar10 = 0;
  while( true ) {
    if (*(long *)(uVar7 + 0x10) == 0) {
      std::__throw_bad_function_call();
    }
    bVar1 = (**(code **)(uVar7 + 0x18))(uVar7,uVar8,__buf,__nbytes);
    uVar5 = ~(-1 << (bVar3 & 0x1f)) & 0x7f;
    if (uVar10 == 0) {
      uVar5 = 0x7f;
    }
    __nbytes = (size_t)uVar10;
    uVar6 = uVar5 ^ 0x7f;
    uVar8 = (ulong)uVar6;
    uVar9 = bVar1 & uVar6;
    uVar5 = (uVar5 & bVar1) << ((byte)uVar10 & 0x1f) | this->value;
    __buf = (void *)(ulong)uVar5;
    this->value = uVar5;
    if ((int)uVar5 < 0) {
      if (uVar9 != uVar6) {
        psVar2 = (string *)__cxa_allocate_exception(0x30);
        local_b0 = local_a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Unused negative LEB bits must be 1s","");
        *(string **)psVar2 = psVar2 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar2,local_b0,local_b0 + local_a8);
        *(undefined4 *)(psVar2 + 0x20) = 0xffffffff;
        *(undefined4 *)(psVar2 + 0x24) = 0xffffffff;
        *(undefined4 *)(psVar2 + 0x28) = 0xffffffff;
        *(undefined4 *)(psVar2 + 0x2c) = 0xffffffff;
        __cxa_throw(psVar2,&ParseException::typeinfo,ParseException::~ParseException);
      }
    }
    else if (uVar9 != 0) {
      psVar2 = (string *)__cxa_allocate_exception(0x30);
      local_90 = local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Unused non-negative LEB bits must be 0s","");
      *(string **)psVar2 = psVar2 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar2,local_90,local_90 + local_88);
      *(undefined4 *)(psVar2 + 0x20) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x24) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x28) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x2c) = 0xffffffff;
      __cxa_throw(psVar2,&ParseException::typeinfo,ParseException::~ParseException);
    }
    if (-1 < (char)bVar1) break;
    bVar3 = bVar3 - 7;
    bVar11 = 0x18 < uVar10;
    uVar10 = uVar10 + 7;
    if (bVar11) {
      psVar2 = (string *)__cxa_allocate_exception(0x30);
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"LEB overflow","");
      *(string **)psVar2 = psVar2 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar2,local_70,local_70 + local_68);
      *(undefined4 *)(psVar2 + 0x20) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x24) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x28) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x2c) = 0xffffffff;
      __cxa_throw(psVar2,&ParseException::typeinfo,ParseException::~ParseException);
    }
  }
  if (uVar10 < 0x19 && 0x3f < bVar1) {
    bVar3 = 0x19 - (byte)uVar10;
    iVar4 = (int)(uVar5 << (bVar3 & 0x1f)) >> (bVar3 & 0x1f);
    this->value = iVar4;
    if (-1 < iVar4) {
      psVar2 = (string *)__cxa_allocate_exception(0x30);
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50," LEBsign-extend should produce a negative value","");
      *(string **)psVar2 = psVar2 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar2,local_50,local_50 + local_48);
      *(undefined4 *)(psVar2 + 0x20) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x24) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x28) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x2c) = 0xffffffff;
      __cxa_throw(psVar2,&ParseException::typeinfo,ParseException::~ParseException);
    }
  }
  return (ssize_t)this;
}

Assistant:

LEB<T, MiniT>& read(std::function<MiniT()> get) {
    value = 0;
    T shift = 0;
    MiniT byte;
    while (1) {
      byte = get();
      bool last = !(byte & 128);
      T payload = byte & 127;
      using mask_type = typename std::make_unsigned<T>::type;
      auto payload_mask = 0 == shift
                            ? ~mask_type(0)
                            : ((mask_type(1) << (sizeof(T) * 8 - shift)) - 1u);
      T significant_payload = payload_mask & payload;
      value |= significant_payload << shift;
      T unused_bits_mask = ~payload_mask & 127;
      T unused_bits = payload & unused_bits_mask;
      if (std::is_signed_v<T> && value < 0) {
        if (unused_bits != unused_bits_mask) {
          throw ParseException("Unused negative LEB bits must be 1s");
        }
      } else {
        if (unused_bits != 0) {
          throw ParseException("Unused non-negative LEB bits must be 0s");
        }
      }
      if (last) {
        break;
      }
      shift += 7;
      if (size_t(shift) >= sizeof(T) * 8) {
        throw ParseException("LEB overflow");
      }
    }
    // If signed LEB, then we might need to sign-extend.
    if constexpr (std::is_signed_v<T>) {
      shift += 7;
      if ((byte & 64) && size_t(shift) < 8 * sizeof(T)) {
        size_t sext_bits = 8 * sizeof(T) - size_t(shift);
        value <<= sext_bits;
        value >>= sext_bits;
        if (value >= 0) {
          throw ParseException(
            " LEBsign-extend should produce a negative value");
        }
      }
    }
    return *this;
  }